

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

void Bus_SclInsertFanout(Vec_Ptr_t *vFanouts,Abc_Obj_t *pObj)

{
  void *pvVar1;
  Abc_Obj_t *p;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void **ppvVar5;
  void *t;
  int k;
  int i;
  Abc_Obj_t *pCur;
  Abc_Obj_t *pObj_local;
  Vec_Ptr_t *vFanouts_local;
  
  t._0_4_ = 0;
  pCur = pObj;
  pObj_local = (Abc_Obj_t *)vFanouts;
  for (t._4_4_ = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj_local), t._4_4_ < iVar2;
      t._4_4_ = t._4_4_ + 1) {
    pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)pObj_local,t._4_4_);
    p = pObj_local;
    if (pvVar4 != (void *)0x0) {
      pvVar4 = Vec_PtrEntry((Vec_Ptr_t *)pObj_local,t._4_4_);
      Vec_PtrWriteEntry((Vec_Ptr_t *)p,(int)t,pvVar4);
      t._0_4_ = (int)t + 1;
    }
  }
  Vec_PtrShrink((Vec_Ptr_t *)pObj_local,(int)t);
  Vec_PtrPush((Vec_Ptr_t *)pObj_local,pCur);
  iVar2 = Vec_PtrSize((Vec_Ptr_t *)pObj_local);
  while( true ) {
    t._4_4_ = iVar2 + -1;
    if (t._4_4_ < 1) {
      return;
    }
    _k = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj_local,iVar2 + -2);
    pCur = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj_local,t._4_4_);
    iVar3 = Bus_SclCompareFanouts((Abc_Obj_t **)&k,&pCur);
    if (iVar3 == -1) break;
    ppvVar5 = Vec_PtrArray((Vec_Ptr_t *)pObj_local);
    pvVar4 = ppvVar5[iVar2 + -2];
    ppvVar5 = Vec_PtrArray((Vec_Ptr_t *)pObj_local);
    pvVar1 = ppvVar5[t._4_4_];
    ppvVar5 = Vec_PtrArray((Vec_Ptr_t *)pObj_local);
    ppvVar5[iVar2 + -2] = pvVar1;
    ppvVar5 = Vec_PtrArray((Vec_Ptr_t *)pObj_local);
    ppvVar5[t._4_4_] = pvVar4;
    iVar2 = t._4_4_;
  }
  return;
}

Assistant:

void Bus_SclInsertFanout( Vec_Ptr_t * vFanouts, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pCur;
    int i, k;
    // compact array
    for ( i = k = 0; i < Vec_PtrSize(vFanouts); i++ )
        if ( Vec_PtrEntry(vFanouts, i) != NULL )
            Vec_PtrWriteEntry( vFanouts, k++, Vec_PtrEntry(vFanouts, i) );
    Vec_PtrShrink( vFanouts, k );
    // insert new entry
    Vec_PtrPush( vFanouts, pObj );
    for ( i = Vec_PtrSize(vFanouts) - 1; i > 0; i-- )
    {
        pCur = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i-1);
        pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i);
        if ( Bus_SclCompareFanouts( &pCur, &pObj ) == -1 )
            break;
        ABC_SWAP( void *, Vec_PtrArray(vFanouts)[i-1], Vec_PtrArray(vFanouts)[i] );
    }
}